

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImFontGlyph * ImVector_ImFontGlyph_insert(ImVector_ImFontGlyph *self,ImFontGlyph *it,ImFontGlyph v)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  ImFontGlyph *__dest;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  __dest = self->Data;
  if (__dest <= it) {
    iVar2 = self->Size;
    lVar3 = (long)iVar2;
    if (it <= __dest + lVar3) {
      lVar6 = (long)it - (long)__dest;
      if (iVar2 == self->Capacity) {
        if (iVar2 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar2 / 2 + iVar2;
        }
        iVar7 = iVar2 + 1;
        if (iVar2 + 1 < iVar5) {
          iVar7 = iVar5;
        }
        __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar7 * 0x28);
        if (self->Data != (ImFontGlyph *)0x0) {
          memcpy(__dest,self->Data,(long)self->Size * 0x28);
          ImGui::MemFree(self->Data);
        }
        self->Data = __dest;
        self->Capacity = iVar7;
        lVar3 = (long)self->Size;
      }
      lVar4 = lVar3 + (lVar6 >> 3) * 0x3333333333333333;
      if (lVar4 != 0 && (lVar6 >> 3) * -0x3333333333333333 <= lVar3) {
        memmove((void *)((long)__dest + lVar6 + 0x28),(void *)((long)__dest + lVar6),lVar4 * 0x28);
        __dest = self->Data;
      }
      *(undefined8 *)((long)__dest + lVar6 + 0x20) = v._32_8_;
      puVar1 = (undefined8 *)((long)__dest + lVar6 + 0x10);
      *puVar1 = v._16_8_;
      puVar1[1] = v._24_8_;
      *(undefined8 *)((long)__dest + lVar6) = v._0_8_;
      ((undefined8 *)((long)__dest + lVar6))[1] = v._8_8_;
      self->Size = self->Size + 1;
      return (ImFontGlyph *)(lVar6 + (long)self->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<ImFontGlyph>::insert(const T *, const T &) [T = ImFontGlyph]");
}

Assistant:

CIMGUI_API int igGetFrameCount()
{
    return ImGui::GetFrameCount();
}